

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpBBs
          (DG2Dot<dg::LLVMNode> *this,DependenceGraph<dg::LLVMNode> *graph,int ind)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  Indent local_2c;
  
  p_Var1 = &(graph->_blocks)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var2 = (graph->_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    dumpBB(this,(BBlock<dg::LLVMNode> *)p_Var2[1]._M_parent,ind);
  }
  if ((this->options & 3) != 0) {
    local_2c.ind = ind;
    operator<<((ostream *)&this->out,&local_2c);
    std::operator<<((ostream *)&this->out,"/* CFG edges */\n");
    for (p_Var2 = (graph->_blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      dumpBBedges(this,(BBlock<dg::LLVMNode> *)p_Var2[1]._M_parent,ind);
    }
  }
  return;
}

Assistant:

void dumpBBs(DependenceGraph<NodeT> *graph, int ind = 1) {
        for (auto it : graph->getBlocks())
            dumpBB(it.second, ind);

        // print CFG edges between BBs
        if (options & (PRINT_CFG | PRINT_REV_CFG)) {
            out << Indent(ind) << "/* CFG edges */\n";
            for (auto it : graph->getBlocks())
                dumpBBedges(it.second, ind);
        }
    }